

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

PromiseFulfillerPair<unsigned_int> * kj::newPromiseAndFulfiller<unsigned_int>(void)

{
  AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_> *pAVar1;
  PromiseFulfillerPair<unsigned_int> *in_RDI;
  Own<kj::_::WeakFulfiller<unsigned_int>_> wrapper;
  Own<kj::_::WeakFulfiller<unsigned_int>_> local_48;
  Own<kj::_::PromiseNode> local_38;
  Own<kj::_::AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>_>
  local_28;
  
  _::WeakFulfiller<unsigned_int>::make();
  heap<kj::_::AdapterPromiseNode<unsigned_int,kj::_::PromiseAndFulfillerAdapter<unsigned_int>>,kj::_::WeakFulfiller<unsigned_int>&>
            ((kj *)&local_28,local_48.ptr);
  pAVar1 = local_28.ptr;
  local_38.disposer = local_28.disposer;
  local_28.ptr = (AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>
                  *)0x0;
  Own<kj::_::AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>_>::
  dispose(&local_28);
  local_38.ptr = (PromiseNode *)0x0;
  (in_RDI->promise).super_PromiseBase.node.disposer = local_28.disposer;
  (in_RDI->promise).super_PromiseBase.node.ptr = (PromiseNode *)pAVar1;
  local_28.ptr = (AdapterPromiseNode<unsigned_int,_kj::_::PromiseAndFulfillerAdapter<unsigned_int>_>
                  *)0x0;
  (in_RDI->fulfiller).disposer = local_48.disposer;
  (in_RDI->fulfiller).ptr = &(local_48.ptr)->super_PromiseFulfiller<unsigned_int>;
  local_48.ptr = (WeakFulfiller<unsigned_int> *)0x0;
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_28);
  Own<kj::_::PromiseNode>::dispose(&local_38);
  Own<kj::_::WeakFulfiller<unsigned_int>_>::dispose(&local_48);
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}